

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O1

MontgomeryPoint * ecc_montgomery_multiply(MontgomeryPoint *B,mp_int *n)

{
  uint swap;
  MontgomeryPoint *orig;
  MontgomeryPoint *dest;
  MontgomeryPoint *dest_00;
  size_t bit;
  uint overwrite;
  MontgomeryPoint *Q;
  MontgomeryPoint *P;
  
  orig = ecc_montgomery_double(B);
  dest = ecc_montgomery_point_copy(B);
  dest_00 = ecc_montgomery_point_copy(orig);
  bit = mp_max_bits(n);
  if (bit != 0) {
    overwrite = 1;
    Q = dest_00;
    P = dest;
    do {
      bit = bit - 1;
      swap = mp_get_bit(n,bit);
      dest_00 = ecc_montgomery_diff_add(P,Q,B);
      mp_cond_swap(P->X,Q->X,swap);
      mp_cond_swap(P->Z,Q->Z,swap);
      dest = ecc_montgomery_double(P);
      ecc_montgomery_point_free(P);
      ecc_montgomery_point_free(Q);
      mp_cond_swap(dest->X,dest_00->X,swap);
      mp_cond_swap(dest->Z,dest_00->Z,swap);
      ecc_montgomery_cond_overwrite(dest,B,overwrite);
      ecc_montgomery_cond_overwrite(dest_00,orig,overwrite);
      overwrite = overwrite & ~swap;
      Q = dest_00;
      P = dest;
    } while (bit != 0);
  }
  ecc_montgomery_point_free(orig);
  ecc_montgomery_point_free(dest_00);
  return dest;
}

Assistant:

MontgomeryPoint *ecc_montgomery_multiply(MontgomeryPoint *B, mp_int *n)
{
    /*
     * 'Montgomery ladder' technique, to compute an arbitrary integer
     * multiple of B under the constraint that you can only add two
     * unequal points if you also know their difference.
     *
     * The setup is that you maintain two curve points one of which is
     * always the other one plus B. Call them kB and (k+1)B, where k
     * is some integer that evolves as we go along. We begin by
     * doubling the input B, to initialise those points to B and 2B,
     * so that k=1.
     *
     * At each stage, we add kB and (k+1)B together - which we can do
     * under the differential-addition constraint because we know
     * their difference is always just B - to give us (2k+1)B. Then we
     * double one of kB or (k+1)B, and depending on which one we
     * choose, we end up with (2k)B or (2k+2)B. Either way, that
     * differs by B from the other value we've just computed. So in
     * each iteration, we do one diff-add and one doubling, plus a
     * couple of conditional swaps to choose which value we double and
     * which way round we put the output points, and the effect is to
     * replace k with either 2k or 2k+1, which we choose based on the
     * appropriate bit of the desired exponent.
     *
     * This routine doesn't assume we know the exact location of the
     * topmost set bit of the exponent. So to maintain constant time
     * it does an iteration for every _potential_ bit, starting from
     * the top downwards; after each iteration in which we haven't
     * seen a set exponent bit yet, we just overwrite the two points
     * with B and 2B again,
     */

    MontgomeryPoint *two_B = ecc_montgomery_double(B);
    MontgomeryPoint *k_B = ecc_montgomery_point_copy(B);
    MontgomeryPoint *kplus1_B = ecc_montgomery_point_copy(two_B);

    unsigned not_started_yet = 1;
    for (size_t bitindex = mp_max_bits(n); bitindex-- > 0 ;) {
        unsigned nbit = mp_get_bit(n, bitindex);

        MontgomeryPoint *sum = ecc_montgomery_diff_add(k_B, kplus1_B, B);
        ecc_montgomery_cond_swap(k_B, kplus1_B, nbit);
        MontgomeryPoint *other = ecc_montgomery_double(k_B);
        ecc_montgomery_point_free(k_B);
        ecc_montgomery_point_free(kplus1_B);
        k_B = other;
        kplus1_B = sum;
        ecc_montgomery_cond_swap(k_B, kplus1_B, nbit);

        ecc_montgomery_cond_overwrite(k_B, B, not_started_yet);
        ecc_montgomery_cond_overwrite(kplus1_B, two_B, not_started_yet);
        not_started_yet &= ~nbit;
    }

    ecc_montgomery_point_free(two_B);
    ecc_montgomery_point_free(kplus1_B);
    return k_B;
}